

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O2

int comma2semicolon(char *string)

{
  byte bVar1;
  int iVar2;
  byte *local_18;
  
LAB_0010d6a2:
  do {
    bVar1 = *string;
    if (bVar1 == 0x22) {
      local_18 = (byte *)string + 1;
      iVar2 = find_doublequote((char **)&local_18);
    }
    else if (bVar1 == 0x27) {
      local_18 = (byte *)string + 1;
      iVar2 = find_quote((char **)&local_18);
    }
    else if (bVar1 == 0x28) {
      local_18 = (byte *)string + 1;
      iVar2 = find_paren((char **)&local_18);
    }
    else {
      if (bVar1 == 0x2c) {
        *string = 0x3b;
LAB_0010d6ee:
        string = (char *)((byte *)string + 1);
        goto LAB_0010d6a2;
      }
      if (bVar1 == 0x5b) {
        local_18 = (byte *)string + 1;
        iVar2 = find_bracket((char **)&local_18);
      }
      else {
        if (bVar1 != 0x7b) {
          if (bVar1 == 0) {
            return (uint)bVar1;
          }
          goto LAB_0010d6ee;
        }
        local_18 = (byte *)string + 1;
        iVar2 = find_curlybracket((char **)&local_18);
      }
    }
    string = (char *)local_18;
    if (iVar2 != 0) {
      return 1;
    }
  } while( true );
}

Assistant:

int comma2semicolon(char *string)

/*  
    replace commas with semicolons, unless the comma is within a quoted or bracketed expression 
*/
{
    char *tstr;

    tstr = string;

    while (*tstr) {

        if (*tstr == ',') { /* found a comma */
           *tstr = ';';
           tstr++;
        } else if (*tstr == '(') { /* found another level of parens */
           tstr++;
           if (find_paren(&tstr)) return(1); 
        } else if (*tstr == '[') { 
           tstr++;
           if (find_bracket(&tstr)) return(1);
        } else if (*tstr == '{') { 
           tstr++;
           if (find_curlybracket(&tstr)) return(1);
        } else if (*tstr == '"') { 
           tstr++;
           if (find_doublequote(&tstr)) return(1);
        } else if (*tstr == '\'') { 
           tstr++;
           if (find_quote(&tstr)) return(1);
        } else { 
           tstr++;
        }
    }
    return(0);  /* reached end of string */
}